

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall iDynTree::Model::Model(Model *this,Model *other)

{
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RSI;
  Model *in_RDI;
  SensorsList *this_00;
  
  in_RDI->_vptr_Model = (_func_int **)&PTR__Model_004fa128;
  std::vector<iDynTree::Link,_std::allocator<iDynTree::Link>_>::vector
            ((vector<iDynTree::Link,_std::allocator<iDynTree::Link>_> *)0x448b4d);
  std::vector<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>::vector
            ((vector<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_> *)0x448b60);
  std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::vector
            ((vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)0x448b73);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x448b86);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x448b99);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x448bac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x448bc2);
  this_00 = (SensorsList *)&in_RDI->neighbors;
  std::
  vector<std::vector<iDynTree::Neighbor,_std::allocator<iDynTree::Neighbor>_>,_std::allocator<std::vector<iDynTree::Neighbor,_std::allocator<iDynTree::Neighbor>_>_>_>
  ::vector((vector<std::vector<iDynTree::Neighbor,_std::allocator<iDynTree::Neighbor>_>,_std::allocator<std::vector<iDynTree::Neighbor,_std::allocator<iDynTree::Neighbor>_>_>_>
            *)0x448bd8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x448bee);
  ModelSolidShapes::ModelSolidShapes((ModelSolidShapes *)0x448c04);
  ModelSolidShapes::ModelSolidShapes((ModelSolidShapes *)0x448c1c);
  SensorsList::SensorsList(this_00);
  copy(in_RDI,in_RSI,src);
  return;
}

Assistant:

Model::Model(const Model& other)
{
    copy(other);
}